

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::Write(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double *p;
  int iVar4;
  size_t count;
  ON_BoundingBox bbox;
  ON_BoundingBox local_60;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_dim);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_is_rat);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[0]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[1]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[0]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[1]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,0);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,0);
    }
    if (bVar1 != false) {
      ON_BoundingBox::ON_BoundingBox(&local_60);
      bVar1 = ON_BinaryArchive::WriteBoundingBox(file,&local_60);
    }
    if (this->m_knot[0] == (double *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar2);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,(long)iVar2,this->m_knot[0]);
    }
    if (this->m_knot[1] == (double *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar2);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,(long)iVar2,this->m_knot[1]);
    }
    count = ((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0);
    iVar2 = 0;
    if (((this->m_cv != (double *)0x0) && (iVar4 = (int)count, 0 < iVar4)) &&
       (0 < this->m_cv_count[0])) {
      iVar2 = this->m_cv_count[0] * this->m_cv_count[1];
      if (this->m_cv_stride[1] < iVar4) {
        iVar2 = 0;
      }
      if (this->m_cv_stride[0] < iVar4) {
        iVar2 = 0;
      }
      if (this->m_cv_count[1] < 1) {
        iVar2 = 0;
      }
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar2);
    }
    if (((0 < iVar2 & bVar1) == 1) && (bVar1 == true && 0 < this->m_cv_count[0])) {
      iVar2 = 0;
      do {
        if ((0 < this->m_cv_count[1]) && (bVar1 != false)) {
          iVar4 = 1;
          do {
            uVar3 = (iVar4 + -1) * this->m_cv_stride[1] + this->m_cv_stride[0] * iVar2;
            p = this->m_cv + uVar3;
            if ((int)uVar3 < 0) {
              p = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              p = (double *)0x0;
            }
            bVar1 = ON_BinaryArchive::WriteDouble(file,count,p);
          } while ((iVar4 < this->m_cv_count[1]) && (iVar4 = iVar4 + 1, bVar1));
        }
        iVar2 = iVar2 + 1;
      } while ((iVar2 < this->m_cv_count[0]) && (bVar1 != false));
    }
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::Write(
       ON_BinaryArchive&  file // open binary file
     ) const
{
  // NOTE - check legacy I/O code if changed
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    if (rc) rc = file.WriteInt( m_dim );
    if (rc) rc = file.WriteInt( m_is_rat );
    if (rc) rc = file.WriteInt( m_order[0] );
    if (rc) rc = file.WriteInt( m_order[1] );
    if (rc) rc = file.WriteInt( m_cv_count[0] );
    if (rc) rc = file.WriteInt( m_cv_count[1] );

    if (rc) rc = file.WriteInt(0); // reserved1
    if (rc) rc = file.WriteInt(0); // reserved2

    if (rc) {
      ON_BoundingBox bbox; // write invalid bounding box - may be used in future
      rc = file.WriteBoundingBox(bbox);
    }
    
    int count = m_knot[0] ? KnotCount(0) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[0] );

    count = m_knot[1] ? KnotCount(1) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[1] );

    const int cv_size = CVSize();
    count = ( m_cv && cv_size > 0
              && m_cv_count[0] > 0 && m_cv_count[1] > 0 
              && m_cv_stride[0] >= cv_size && m_cv_stride[1] >= cv_size) 
          ? m_cv_count[0]*m_cv_count[1]
          : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc && count > 0 ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.WriteDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  return rc;
}